

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phix_manager.c
# Opt level: O3

int write_phix(int coff,opj_codestream_info_t cstr_info,opj_bool EPHused,int j2klen,opj_cio_t *cio)

{
  bool bVar1;
  int v;
  bool bVar2;
  OPJ_UINT32 OVar3;
  int pos;
  opj_jp2_box_t *box;
  long lVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  opj_codestream_info_t *poVar6;
  double *pdVar7;
  int second;
  ulong uVar8;
  OPJ_UINT32 *pOVar9;
  ulong uVar10;
  byte bVar11;
  opj_codestream_info_t in_stack_ffffffffffffff48;
  int local_48;
  
  v = cstr_info.numcomps;
  bVar11 = 0;
  uVar10 = (ulong)(uint)cstr_info.numcomps;
  box = (opj_jp2_box_t *)calloc((long)cstr_info.numcomps,0xc);
  second = 0;
  local_48 = 0;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    if (!bVar1) {
      cio_seek(cio,local_48);
    }
    local_48 = cio_tell(cio);
    cio_skip(cio,4);
    cio_write(cio,0x70686978,4);
    write_manf(second,v,box,cio);
    if (0 < v) {
      uVar8 = 0;
      uVar5 = extraout_RDX;
      pOVar9 = &box->type;
      do {
        poVar6 = &cstr_info;
        pdVar7 = (double *)&stack0xffffffffffffff48;
        for (lVar4 = 0xe; lVar4 != 0; lVar4 = lVar4 + -1) {
          *pdVar7 = poVar6->D_max;
          poVar6 = (opj_codestream_info_t *)((long)poVar6 + (ulong)bVar11 * -0x10 + 8);
          pdVar7 = pdVar7 + (ulong)bVar11 * -2 + 1;
        }
        OVar3 = write_phixfaix(coff,(int)uVar8,in_stack_ffffffffffffff48,(opj_bool)uVar5,0,cio);
        ((opj_jp2_box_t *)(pOVar9 + -1))->length = OVar3;
        *pOVar9 = 0x66616978;
        uVar8 = uVar8 + 1;
        pOVar9 = pOVar9 + 3;
        uVar5 = extraout_RDX_00;
      } while (uVar10 != uVar8);
    }
    pos = cio_tell(cio);
    cio_seek(cio,local_48);
    cio_write(cio,(long)(pos - local_48),4);
    cio_seek(cio,pos);
    second = 1;
    bVar2 = false;
  } while (bVar1);
  free(box);
  return pos - local_48;
}

Assistant:

int write_phix( int coff, opj_codestream_info_t cstr_info, opj_bool EPHused, int j2klen, opj_cio_t *cio)
{
  int len, lenp=0, compno, i;
  opj_jp2_box_t *box;

  box = (opj_jp2_box_t *)opj_calloc( cstr_info.numcomps, sizeof(opj_jp2_box_t));
  
  for( i=0;i<2;i++){
    if (i) cio_seek( cio, lenp);
      
    lenp = cio_tell( cio);
    cio_skip( cio, 4);              /* L [at the end] */
    cio_write( cio, JPIP_PHIX, 4);  /* PHIX           */
      
    write_manf( i, cstr_info.numcomps, box, cio);

    for( compno=0; compno<cstr_info.numcomps; compno++){       
      box[compno].length = write_phixfaix( coff, compno, cstr_info, EPHused, j2klen, cio);
      box[compno].type = JPIP_FAIX;
    }

    len = cio_tell( cio)-lenp;
    cio_seek( cio, lenp);
    cio_write( cio, len, 4);        /* L              */
    cio_seek( cio, lenp+len);
  }

  opj_free(box);

  return len;
}